

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O2

void __thiscall vsencoding::BitsWriter::bit_writer(BitsWriter *this,uint32_t value,uint32_t bits)

{
  uint32_t *puVar1;
  sbyte sVar2;
  ulong uVar3;
  uint uVar4;
  
  if (bits != 0) {
    sVar2 = ((byte)bits < 0x21) * (' ' - (byte)bits);
    uVar3 = (ulong)((value << sVar2) >> sVar2) | this->buffer << ((ulong)bits & 0x3f);
    this->buffer = uVar3;
    uVar4 = bits + this->Fill;
    this->Fill = uVar4;
    if (0x1f < uVar4) {
      puVar1 = this->data;
      this->data = puVar1 + 1;
      *puVar1 = (uint32_t)(uVar3 >> ((ulong)(byte)((char)uVar4 - 0x20) & 0x3f));
      this->written = this->written + 1;
      this->Fill = this->Fill - 0x20;
    }
  }
  return;
}

Assistant:

inline void BitsWriter::bit_writer(uint32_t value, uint32_t bits) {
  if (bits == 0)
    return;

  buffer = (buffer << bits) | (value & ((1ULL << bits) - 1));

  Fill += bits;

  if (Fill >= 32) {
    *data++ = (buffer >> (Fill - 32)) & ((1ULL << 32) - 1);
    written++;
    Fill -= 32;
  }
}